

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SenderStream.cpp
# Opt level: O3

SenderFlow * __thiscall
SenderStream::create_flow(SenderStream *this,string *name,string *bind,int port)

{
  pointer pcVar1;
  SenderFlow *this_00;
  mapped_type *ppSVar2;
  string local_70;
  string local_50;
  
  this_00 = (SenderFlow *)operator_new(0x38);
  pcVar1 = (bind->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + bind->_M_string_length);
  SenderFlow::SenderFlow(this_00,&local_70,port);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  SenderFlow::set_name(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppSVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SenderFlow_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SenderFlow_*>_>_>
            ::operator[](&this->m_flows,name);
  *ppSVar2 = this_00;
  return this_00;
}

Assistant:

SenderFlow * SenderStream::create_flow(std::string name, std::string bind, int port)
{
    SenderFlow * flow = new SenderFlow(bind, port);
    flow->set_name(name);
    m_flows[name] = flow;
    return flow;
}